

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::TextureSpecificationTests::init
          (TextureSpecificationTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dataType;
  char *pcVar1;
  Context *pCVar2;
  long *plVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  uint uVar6;
  int extraout_EAX;
  TextureSpecCase *pTVar7;
  long *plVar8;
  TextureFormat TVar9;
  TextureSpecCase *pTVar10;
  TestNode *pTVar11;
  undefined8 *puVar12;
  long *plVar13;
  ulong uVar14;
  long lVar15;
  int width;
  Context *pCVar16;
  long *local_240;
  undefined8 local_238;
  long local_230;
  undefined8 uStack_228;
  ulong local_220;
  TextureSpecCase *local_218;
  TestNode *local_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8 [2];
  Context *local_1c8;
  Context *local_1c0;
  Random rnd;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  pTVar7 = (TextureSpecCase *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_teximage2d","Basic glTexImage2D() usage");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
  lVar15 = 0;
  local_218 = pTVar7;
  do {
    pcVar1 = *(char **)((long)&DAT_0212c380 + lVar15);
    local_220 = CONCAT44(local_220._4_4_,*(undefined4 *)((long)&DAT_0212c388 + lVar15));
    local_210 = (TestNode *)CONCAT44(local_210._4_4_,*(undefined4 *)((long)&DAT_0212c38c + lVar15));
    pTVar7 = (TextureSpecCase *)operator_new(0xa08);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,pcVar1,(allocator<char> *)&local_208);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
    local_1a8 = &local_198;
    plVar13 = plVar8 + 2;
    if ((long *)*plVar8 == plVar13) {
      local_198 = *plVar13;
      lStack_190 = plVar8[3];
    }
    else {
      local_198 = *plVar13;
      local_1a8 = (long *)*plVar8;
    }
    plVar3 = local_1a8;
    local_1a0 = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    TVar9 = glu::mapGLTransferFormat((deUint32)local_220,(deUint32)local_210);
    TextureSpecCase::TextureSpecCase
              (pTVar7,pCVar2,(char *)plVar3,::glcts::fixed_sample_locations_values + 1,
               TEXTURETYPE_2D,TVar9,1,0x40,0x80);
    (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureSpecCase_0212c5a8;
    *(deUint32 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (deUint32)local_220;
    *(deUint32 *)((long)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
         = (deUint32)local_210;
    tcu::TestNode::addChild((TestNode *)local_218,(TestNode *)pTVar7);
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    pTVar7 = local_218;
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    pTVar10 = (TextureSpecCase *)operator_new(0xa08);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,pcVar1,(allocator<char> *)&local_208);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
    local_1a8 = &local_198;
    plVar13 = plVar8 + 2;
    if ((long *)*plVar8 == plVar13) {
      local_198 = *plVar13;
      lStack_190 = plVar8[3];
    }
    else {
      local_198 = *plVar13;
      local_1a8 = (long *)*plVar8;
    }
    plVar3 = local_1a8;
    local_1a0 = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    TVar9 = glu::mapGLTransferFormat((deUint32)local_220,(deUint32)local_210);
    TextureSpecCase::TextureSpecCase
              (pTVar10,pCVar2,(char *)plVar3,::glcts::fixed_sample_locations_values + 1,
               TEXTURETYPE_CUBE,TVar9,1,0x40,0x40);
    (pTVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureSpecCase_0212c600;
    *(deUint32 *)&pTVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (deUint32)local_220;
    *(deUint32 *)((long)&pTVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
         = (deUint32)local_210;
    tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pTVar10);
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0x80);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "random_teximage2d","Randomized glTexImage2D() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  deRandom_init(&rnd.m_rnd,9);
  local_220 = 0;
  local_210 = pTVar11;
  do {
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    dVar5 = deRandom_getUint32(&rnd.m_rnd);
    pCVar16 = (Context *)(ulong)(uint)(4 << ((char)(dVar5 / 7) * -7 + (char)dVar5 & 0x1fU));
    dVar5 = deRandom_getUint32(&rnd.m_rnd);
    pTVar7 = (TextureSpecCase *)operator_new(0xa08);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_208 = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"2d_","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<((ostringstream *)&local_1a8,(int)local_220);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar14 = 0xf;
    if (local_208 != local_1f8) {
      uVar14 = local_1f8[0];
    }
    local_218 = pTVar7;
    local_1c8 = pCVar16;
    local_1c0 = pCVar2;
    if (uVar14 < (ulong)(local_1e0 + local_200)) {
      uVar14 = 0xf;
      if (local_1e8 != local_1d8) {
        uVar14 = local_1d8[0];
      }
      if (uVar14 < (ulong)(local_1e0 + local_200)) goto LAB_00f4ba64;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_208);
    }
    else {
LAB_00f4ba64:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1e8);
    }
    pTVar7 = local_218;
    local_240 = &local_230;
    plVar8 = puVar12 + 2;
    if ((long *)*puVar12 == plVar8) {
      local_230 = *plVar8;
      uStack_228 = puVar12[3];
    }
    else {
      local_230 = *plVar8;
      local_240 = (long *)*puVar12;
    }
    plVar13 = local_240;
    local_238 = puVar12[1];
    *puVar12 = plVar8;
    puVar12[1] = 0;
    *(undefined1 *)plVar8 = 0;
    uVar14 = (ulong)((dVar4 & 7) << 4);
    dVar4 = *(deUint32 *)((long)&DAT_0212c388 + uVar14);
    dataType = *(deUint32 *)((long)&DAT_0212c38c + uVar14);
    TVar9 = glu::mapGLTransferFormat(dVar4,dataType);
    TextureSpecCase::TextureSpecCase
              (pTVar7,local_1c0,(char *)plVar13,::glcts::fixed_sample_locations_values + 1,
               TEXTURETYPE_2D,TVar9,1,(int)local_1c8,
               4 << ((char)(dVar5 / 7) * -7 + (char)dVar5 & 0x1fU));
    (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureSpecCase_0212c658;
    *(deUint32 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar4;
    *(deUint32 *)((long)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
         = dataType;
    tcu::TestNode::addChild(local_210,(TestNode *)pTVar7);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    uVar6 = (int)local_220 + 1;
    local_220 = (ulong)uVar6;
  } while (uVar6 != 10);
  local_220 = 0;
  do {
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    dVar5 = deRandom_getUint32(&rnd.m_rnd);
    width = 4 << ((char)(dVar5 / 7) * -7 + (char)dVar5 & 0x1fU);
    local_218 = (TextureSpecCase *)operator_new(0xa08);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_208 = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"cube_","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<((ostringstream *)&local_1a8,(int)local_220);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar14 = 0xf;
    if (local_208 != local_1f8) {
      uVar14 = local_1f8[0];
    }
    local_1c8 = pCVar2;
    if (uVar14 < (ulong)(local_1e0 + local_200)) {
      uVar14 = 0xf;
      if (local_1e8 != local_1d8) {
        uVar14 = local_1d8[0];
      }
      if (uVar14 < (ulong)(local_1e0 + local_200)) goto LAB_00f4bce3;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_208);
    }
    else {
LAB_00f4bce3:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1e8);
    }
    pTVar7 = local_218;
    local_240 = &local_230;
    plVar8 = puVar12 + 2;
    if ((long *)*puVar12 == plVar8) {
      local_230 = *plVar8;
      uStack_228 = puVar12[3];
    }
    else {
      local_230 = *plVar8;
      local_240 = (long *)*puVar12;
    }
    plVar13 = local_240;
    local_238 = puVar12[1];
    *puVar12 = plVar8;
    puVar12[1] = 0;
    *(undefined1 *)plVar8 = 0;
    uVar14 = (ulong)((dVar4 & 7) << 4);
    dVar4 = *(deUint32 *)((long)&DAT_0212c388 + uVar14);
    dVar5 = *(deUint32 *)((long)&DAT_0212c38c + uVar14);
    TVar9 = glu::mapGLTransferFormat(dVar4,dVar5);
    TextureSpecCase::TextureSpecCase
              (pTVar7,local_1c8,(char *)plVar13,::glcts::fixed_sample_locations_values + 1,
               TEXTURETYPE_CUBE,TVar9,1,width,width);
    (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureSpecCase_0212c6b0;
    *(deUint32 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar4;
    *(deUint32 *)((long)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
         = dVar5;
    tcu::TestNode::addChild(local_210,(TestNode *)pTVar7);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    uVar6 = (int)local_220 + 1;
    local_220 = (ulong)uVar6;
    if (uVar6 == 10) {
      pTVar11 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "teximage2d_align","glTexImage2D() unpack alignment tests");
      tcu::TestNode::addChild((TestNode *)this,pTVar11);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_4_8",::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D
                 ,TVar9,1,4,8);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_63_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x3f,0x1e);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_63_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x3f,0x1e);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_63_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x3f,0x1e);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_63_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x3f,0x1e);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba4444_51_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x33,0x1e);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba4444_51_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x33,0x1e);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba4444_51_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x33,0x1e);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba4444_51_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x33,0x1e);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgb888_39_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x27,0x2b);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgb888_39_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x27,0x2b);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgb888_39_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x27,0x2b);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgb888_39_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x27,0x2b);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba8888_47_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x2f,0x1b);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba8888_47_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x2f,0x1b);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba8888_47_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x2f,0x1b);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba8888_47_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x2f,0x1b);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c708;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_4_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,1,4,4);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_63_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x3f,0x3f);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_63_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x3f,0x3f);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_63_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x3f,0x3f);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_63_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x3f,0x3f);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba4444_51_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x33,0x33);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba4444_51_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x33,0x33);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba4444_51_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x33,0x33);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba4444_51_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x33,0x33);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgb888_39_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x27,0x27);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgb888_39_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x27,0x27);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgb888_39_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x27,0x27);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgb888_39_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x27,0x27);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba8888_47_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x2f,0x2f);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba8888_47_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x2f,0x2f);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba8888_47_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x2f,0x2f);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa10);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba8888_47_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x2f,0x2f);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c760;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar11 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "basic_texsubimage2d","Basic glTexSubImage2D() usage");
      tcu::TestNode::addChild((TestNode *)this,pTVar11);
      lVar15 = 0;
      local_218 = (TextureSpecCase *)pTVar11;
      do {
        pcVar1 = *(char **)((long)&DAT_0212c380 + lVar15);
        local_220 = CONCAT44(local_220._4_4_,*(undefined4 *)((long)&DAT_0212c388 + lVar15));
        local_210 = (TestNode *)
                    CONCAT44(local_210._4_4_,*(undefined4 *)((long)&DAT_0212c38c + lVar15));
        pTVar7 = (TextureSpecCase *)operator_new(0xa08);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,pcVar1,(allocator<char> *)&local_208);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
        local_1a8 = &local_198;
        plVar13 = plVar8 + 2;
        if ((long *)*plVar8 == plVar13) {
          local_198 = *plVar13;
          lStack_190 = plVar8[3];
        }
        else {
          local_198 = *plVar13;
          local_1a8 = (long *)*plVar8;
        }
        plVar3 = local_1a8;
        local_1a0 = plVar8[1];
        *plVar8 = (long)plVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        TVar9 = glu::mapGLTransferFormat((deUint32)local_220,(deUint32)local_210);
        TextureSpecCase::TextureSpecCase
                  (pTVar7,pCVar2,(char *)plVar3,::glcts::fixed_sample_locations_values + 1,
                   TEXTURETYPE_2D,TVar9,1,0x40,0x80);
        (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureSpecCase_0212c7b8;
        *(deUint32 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (deUint32)local_220;
        *(deUint32 *)
         ((long)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
             (deUint32)local_210;
        tcu::TestNode::addChild((TestNode *)local_218,(TestNode *)pTVar7);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        pTVar7 = local_218;
        if (local_240 != &local_230) {
          operator_delete(local_240,local_230 + 1);
        }
        pTVar10 = (TextureSpecCase *)operator_new(0xa08);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,pcVar1,(allocator<char> *)&local_208);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
        local_1a8 = &local_198;
        plVar13 = plVar8 + 2;
        if ((long *)*plVar8 == plVar13) {
          local_198 = *plVar13;
          lStack_190 = plVar8[3];
        }
        else {
          local_198 = *plVar13;
          local_1a8 = (long *)*plVar8;
        }
        plVar3 = local_1a8;
        local_1a0 = plVar8[1];
        *plVar8 = (long)plVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        TVar9 = glu::mapGLTransferFormat((deUint32)local_220,(deUint32)local_210);
        TextureSpecCase::TextureSpecCase
                  (pTVar10,pCVar2,(char *)plVar3,::glcts::fixed_sample_locations_values + 1,
                   TEXTURETYPE_CUBE,TVar9,1,0x40,0x40);
        (pTVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureSpecCase_0212c810;
        *(deUint32 *)&pTVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (deUint32)local_220;
        *(deUint32 *)
         ((long)&pTVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
             (deUint32)local_210;
        tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pTVar10);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,local_230 + 1);
        }
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x80);
      pTVar11 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "texsubimage2d_empty_tex",
                 "glTexSubImage2D() to texture that has storage but no data");
      tcu::TestNode::addChild((TestNode *)this,pTVar11);
      lVar15 = 0;
      local_218 = (TextureSpecCase *)pTVar11;
      do {
        pcVar1 = *(char **)((long)&DAT_0212c380 + lVar15);
        local_220 = CONCAT44(local_220._4_4_,*(undefined4 *)((long)&DAT_0212c388 + lVar15));
        local_210 = (TestNode *)
                    CONCAT44(local_210._4_4_,*(undefined4 *)((long)&DAT_0212c38c + lVar15));
        pTVar7 = (TextureSpecCase *)operator_new(0xa08);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,pcVar1,(allocator<char> *)&local_208);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
        local_1a8 = &local_198;
        plVar13 = plVar8 + 2;
        if ((long *)*plVar8 == plVar13) {
          local_198 = *plVar13;
          lStack_190 = plVar8[3];
        }
        else {
          local_198 = *plVar13;
          local_1a8 = (long *)*plVar8;
        }
        plVar3 = local_1a8;
        local_1a0 = plVar8[1];
        *plVar8 = (long)plVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        TVar9 = glu::mapGLTransferFormat((deUint32)local_220,(deUint32)local_210);
        TextureSpecCase::TextureSpecCase
                  (pTVar7,pCVar2,(char *)plVar3,::glcts::fixed_sample_locations_values + 1,
                   TEXTURETYPE_2D,TVar9,1,0x40,0x20);
        (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureSpecCase_0212c868;
        *(deUint32 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (deUint32)local_220;
        *(deUint32 *)
         ((long)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
             (deUint32)local_210;
        tcu::TestNode::addChild((TestNode *)local_218,(TestNode *)pTVar7);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        pTVar7 = local_218;
        if (local_240 != &local_230) {
          operator_delete(local_240,local_230 + 1);
        }
        pTVar10 = (TextureSpecCase *)operator_new(0xa08);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,pcVar1,(allocator<char> *)&local_208);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
        local_1a8 = &local_198;
        plVar13 = plVar8 + 2;
        if ((long *)*plVar8 == plVar13) {
          local_198 = *plVar13;
          lStack_190 = plVar8[3];
        }
        else {
          local_198 = *plVar13;
          local_1a8 = (long *)*plVar8;
        }
        plVar3 = local_1a8;
        local_1a0 = plVar8[1];
        *plVar8 = (long)plVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        TVar9 = glu::mapGLTransferFormat((deUint32)local_220,(deUint32)local_210);
        TextureSpecCase::TextureSpecCase
                  (pTVar10,pCVar2,(char *)plVar3,::glcts::fixed_sample_locations_values + 1,
                   TEXTURETYPE_CUBE,TVar9,1,0x20,0x20);
        (pTVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureSpecCase_0212c8c0;
        *(deUint32 *)&pTVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (deUint32)local_220;
        *(deUint32 *)
         ((long)&pTVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
             (deUint32)local_210;
        tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pTVar10);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,local_230 + 1);
        }
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x80);
      pTVar11 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "texsubimage2d_align","glTexSubImage2D() unpack alignment tests");
      tcu::TestNode::addChild((TestNode *)this,pTVar11);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_1_1",::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D
                 ,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x110000000d
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           &DAT_600000001;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_1_2",::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D
                 ,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x110000000d
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           &DAT_600000001;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_1_4",::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D
                 ,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x110000000d
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           &DAT_600000001;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_1_8",::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D
                 ,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x110000000d
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           &DAT_600000001;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_63_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x900000001;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e0000003f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_63_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x900000001;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e0000003f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_63_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x900000001;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e0000003f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_l8_63_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x900000001;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e0000003f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba4444_51_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x1d00000007
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e00000033;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba4444_51_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x1d00000007
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e00000033;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba4444_51_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x1d00000007
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e00000033;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba4444_51_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x1d00000007
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e00000033;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgb888_39_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x80000000b;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x2b00000027;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgb888_39_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x80000000b;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x2b00000027;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgb888_39_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x80000000b;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x2b00000027;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgb888_39_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x80000000b;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x2b00000027;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba8888_47_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x10000000a;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1b0000002f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba8888_47_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x10000000a;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1b0000002f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba8888_47_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x10000000a;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1b0000002f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba8888_47_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c918;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x10000000a;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1b0000002f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_1_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x110000000d
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           &DAT_600000001;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_1_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x110000000d
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           &DAT_600000001;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_1_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x110000000d
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           &DAT_600000001;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_1_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x110000000d
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           &DAT_600000001;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_63_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x900000001;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e0000003f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_63_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x900000001;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e0000003f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_63_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x900000001;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e0000003f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_l8_63_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x900000001;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e0000003f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba4444_51_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x1d00000007
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e00000033;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba4444_51_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x1d00000007
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e00000033;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba4444_51_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x1d00000007
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e00000033;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x8033);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba4444_51_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x803300001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x1d00000007
      ;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1e00000033;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgb888_39_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x80000000b;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x2b00000027;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgb888_39_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x80000000b;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x2b00000027;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgb888_39_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x80000000b;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x2b00000027;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgb888_39_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x80000000b;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x2b00000027;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba8888_47_1",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x10000000a;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1b0000002f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 1;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba8888_47_2",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x10000000a;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1b0000002f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 2;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba8888_47_4",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x10000000a;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1b0000002f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 4;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa20);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba8888_47_8",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,0,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c970;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x10000000a;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)0x1b0000002f;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
           = 8;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar11 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "basic_copyteximage2d","Basic glCopyTexImage2D() usage");
      tcu::TestNode::addChild((TestNode *)this,pTVar11);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      TextureSpecCase::TextureSpecCase
                (pTVar7,(this->super_TestCaseGroup).m_context,"2d_alpha",
                 ::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D,
                 (TextureFormat)0x300000001,1,0x80,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c9c8;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x1906
      ;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      TextureSpecCase::TextureSpecCase
                (pTVar7,(this->super_TestCaseGroup).m_context,"2d_luminance",
                 ::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D,
                 (TextureFormat)0x300000003,1,0x80,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c9c8;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x1909
      ;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      TextureSpecCase::TextureSpecCase
                (pTVar7,(this->super_TestCaseGroup).m_context,"2d_luminance_alpha",
                 ::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D,
                 (TextureFormat)0x300000004,1,0x80,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c9c8;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x190a
      ;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      TextureSpecCase::TextureSpecCase
                (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgb",
                 ::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D,
                 (TextureFormat)0x300000007,1,0x80,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c9c8;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x1907
      ;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      TextureSpecCase::TextureSpecCase
                (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgba",
                 ::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D,
                 (TextureFormat)0x300000008,1,0x80,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212c9c8;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x1908
      ;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      TextureSpecCase::TextureSpecCase
                (pTVar7,(this->super_TestCaseGroup).m_context,"cube_alpha",
                 ::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_CUBE,
                 (TextureFormat)0x300000001,1,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212caa0;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x1906
      ;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      TextureSpecCase::TextureSpecCase
                (pTVar7,(this->super_TestCaseGroup).m_context,"cube_luminance",
                 ::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_CUBE,
                 (TextureFormat)0x300000003,1,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212caa0;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x1909
      ;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      TextureSpecCase::TextureSpecCase
                (pTVar7,(this->super_TestCaseGroup).m_context,"cube_luminance_alpha",
                 ::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_CUBE,
                 (TextureFormat)0x300000004,1,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212caa0;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x190a
      ;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      TextureSpecCase::TextureSpecCase
                (pTVar7,(this->super_TestCaseGroup).m_context,"cube_rgb",
                 ::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_CUBE,
                 (TextureFormat)0x300000007,1,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212caa0;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x1907
      ;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      TextureSpecCase::TextureSpecCase
                (pTVar7,(this->super_TestCaseGroup).m_context,"cube_rgba",
                 ::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_CUBE,
                 (TextureFormat)0x300000008,1,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212caa0;
      *(undefined4 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x1908
      ;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar11 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "basic_copytexsubimage2d","Basic glCopyTexSubImage2D() usage");
      tcu::TestNode::addChild((TestNode *)this,pTVar11);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1906,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_alpha",::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D,
                 TVar9,1,0x80,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212caf8;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001906;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_luminance",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,1,0x80,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212caf8;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x190a,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_luminance_alpha",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_2D,TVar9,1,0x80,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212caf8;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x14010000190a;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgb",::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D,
                 TVar9,1,0x80,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212caf8;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"2d_rgba",::glcts::fixed_sample_locations_values + 1,TEXTURETYPE_2D,
                 TVar9,1,0x80,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212caf8;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1906,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_alpha",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,1,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212cb50;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001906;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1909,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_luminance",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,1,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212cb50;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001909;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x190a,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_luminance_alpha",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,1,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212cb50;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x14010000190a;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1907,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgb",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,1,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212cb50;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001907;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      pTVar7 = (TextureSpecCase *)operator_new(0xa08);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      TVar9 = glu::mapGLTransferFormat(0x1908,0x1401);
      TextureSpecCase::TextureSpecCase
                (pTVar7,pCVar2,"cube_rgba",::glcts::fixed_sample_locations_values + 1,
                 TEXTURETYPE_CUBE,TVar9,1,0x40,0x40);
      (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TextureSpecCase_0212cb50;
      pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)0x140100001908;
      tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar7);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void TextureSpecificationTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	// Basic TexImage2D usage.
	{
		tcu::TestCaseGroup* basicTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_teximage2d", "Basic glTexImage2D() usage");
		addChild(basicTexImageGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			const char*	fmtName		= texFormats[formatNdx].name;
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			const int	tex2DWidth	= 64;
			const int	tex2DHeight	= 128;
			const int	texCubeSize	= 64;

			basicTexImageGroup->addChild(new BasicTexImage2DCase	(m_context,	(string(fmtName) + "_2d").c_str(),		"",	format, dataType, MIPMAPS, tex2DWidth, tex2DHeight));
			basicTexImageGroup->addChild(new BasicTexImageCubeCase	(m_context,	(string(fmtName) + "_cube").c_str(),	"",	format, dataType, MIPMAPS, texCubeSize, texCubeSize));
		}
	}

	// Randomized TexImage2D order.
	{
		tcu::TestCaseGroup* randomTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "random_teximage2d", "Randomized glTexImage2D() usage");
		addChild(randomTexImageGroup);

		de::Random rnd(9);

		// 2D cases.
		for (int ndx = 0; ndx < 10; ndx++)
		{
			int		formatNdx	= rnd.getInt(0, DE_LENGTH_OF_ARRAY(texFormats)-1);
			int		width		= 1 << rnd.getInt(2, 8);
			int		height		= 1 << rnd.getInt(2, 8);

			randomTexImageGroup->addChild(new RandomOrderTexImage2DCase(m_context, (string("2d_") + de::toString(ndx)).c_str(), "", texFormats[formatNdx].format, texFormats[formatNdx].dataType, MIPMAPS, width, height));
		}

		// Cubemap cases.
		for (int ndx = 0; ndx < 10; ndx++)
		{
			int		formatNdx	= rnd.getInt(0, DE_LENGTH_OF_ARRAY(texFormats)-1);
			int		size		= 1 << rnd.getInt(2, 8);

			randomTexImageGroup->addChild(new RandomOrderTexImageCubeCase(m_context, (string("cube_") + de::toString(ndx)).c_str(), "", texFormats[formatNdx].format, texFormats[formatNdx].dataType, MIPMAPS, size, size));
		}
	}

	// TexImage2D unpack alignment.
	{
		tcu::TestCaseGroup* alignGroup = new tcu::TestCaseGroup(m_testCtx, "teximage2d_align", "glTexImage2D() unpack alignment tests");
		addChild(alignGroup);

		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_4_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			MIPMAPS,	 4, 8, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_1",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_2",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_4",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_8",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_1",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_2",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_4",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_8",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 8));

		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_4_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			MIPMAPS,	 4, 4, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_1",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_2",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_4",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_8",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_1",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_2",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_4",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_8",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 8));
	}

	// Basic TexSubImage2D usage.
	{
		tcu::TestCaseGroup* basicTexSubImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_texsubimage2d", "Basic glTexSubImage2D() usage");
		addChild(basicTexSubImageGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			const char*	fmtName		= texFormats[formatNdx].name;
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			const int	tex2DWidth	= 64;
			const int	tex2DHeight	= 128;
			const int	texCubeSize	= 64;

			basicTexSubImageGroup->addChild(new BasicTexSubImage2DCase		(m_context,	(string(fmtName) + "_2d").c_str(),		"",	format, dataType, MIPMAPS, tex2DWidth, tex2DHeight));
			basicTexSubImageGroup->addChild(new BasicTexSubImageCubeCase	(m_context,	(string(fmtName) + "_cube").c_str(),	"",	format, dataType, MIPMAPS, texCubeSize, texCubeSize));
		}
	}

	// TexSubImage2D to empty texture.
	{
		tcu::TestCaseGroup* texSubImageEmptyTexGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage2d_empty_tex", "glTexSubImage2D() to texture that has storage but no data");
		addChild(texSubImageEmptyTexGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			const char*	fmtName		= texFormats[formatNdx].name;
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			const int	tex2DWidth	= 64;
			const int	tex2DHeight	= 32;
			const int	texCubeSize	= 32;

			texSubImageEmptyTexGroup->addChild(new TexSubImage2DEmptyTexCase	(m_context,	(string(fmtName) + "_2d").c_str(),		"",	format, dataType, MIPMAPS, tex2DWidth, tex2DHeight));
			texSubImageEmptyTexGroup->addChild(new TexSubImageCubeEmptyTexCase	(m_context,	(string(fmtName) + "_cube").c_str(),	"",	format, dataType, MIPMAPS, texCubeSize, texCubeSize));
		}
	}

	// TexSubImage2D alignment cases.
	{
		tcu::TestCaseGroup* alignGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage2d_align", "glTexSubImage2D() unpack alignment tests");
		addChild(alignGroup);

		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_1",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_2",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_4",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_8",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_1",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_2",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_4",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_8",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 8));

		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_1",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_2",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_4",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_8",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_1",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_2",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_4",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_8",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 8));
	}

	// Basic glCopyTexImage2D() cases
	{
		tcu::TestCaseGroup* copyTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_copyteximage2d", "Basic glCopyTexImage2D() usage");
		addChild(copyTexImageGroup);

		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_alpha",				"",	GL_ALPHA,			MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_luminance",			"",	GL_LUMINANCE,		MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_rgb",				"",	GL_RGB,				MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_rgba",				"",	GL_RGBA,			MIPMAPS,	128, 64));

		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_alpha",			"",	GL_ALPHA,			MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_luminance",		"",	GL_LUMINANCE,		MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_rgb",				"",	GL_RGB,				MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_rgba",			"",	GL_RGBA,			MIPMAPS,	64, 64));
	}

	// Basic glCopyTexSubImage2D() cases
	{
		tcu::TestCaseGroup* copyTexSubImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_copytexsubimage2d", "Basic glCopyTexSubImage2D() usage");
		addChild(copyTexSubImageGroup);

		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_alpha",				"",	GL_ALPHA,			GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_luminance",			"",	GL_LUMINANCE,		GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_rgb",				"",	GL_RGB,				GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_rgba",				"",	GL_RGBA,			GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));

		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_alpha",			"",	GL_ALPHA,			GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_luminance",		"",	GL_LUMINANCE,		GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_rgb",				"",	GL_RGB,				GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_rgba",			"",	GL_RGBA,			GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
	}
}